

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O1

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetPlanarAuxOffset
          (GmmResourceInfoCommon *this,uint32_t ArrayIndex,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  GMM_GFX_SIZE_T GVar2;
  int iVar3;
  undefined4 extraout_var;
  GMM_GFX_SIZE_T GVar4;
  
  if (((this->Surf).Flags.Gpu.field_0x4 & 0x20) == 0) {
    return 0;
  }
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 0x1f) & 2) != 0) {
    return 0;
  }
  if (GmmAuxType == GMM_AUX_COMP_STATE) {
    GVar4 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1] + (this->Surf).Size +
            (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
  }
  else if (GmmAuxType == GMM_AUX_UV_CCS) {
    aVar1 = (this->Surf).Flags.Gpu;
    GVar2 = (this->Surf).Size;
    if ((((ulong)aVar1 & 2) == 0) || (((this->AuxSurf).Flags.Gpu.field_0x5 & 8) == 0)) {
      GVar4 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[6] *
              (this->AuxSurf).Pitch + GVar2;
      if (((aVar1._0_4_ >> 0x10 & 1) == 0) || (((this->AuxSurf).Flags.Gpu.field_0x5 & 8) == 0))
      goto LAB_001aa220;
      GVar4 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1];
    }
    else {
      GVar4 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
    }
    GVar4 = GVar2 + GVar4;
  }
  else if (GmmAuxType == GMM_AUX_Y_CCS) {
    GVar4 = (this->Surf).Size;
  }
  else {
    GVar4 = 0;
  }
LAB_001aa220:
  return (ulong)ArrayIndex * (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Mip0SlicePitch +
         GVar4;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetPlanarAuxOffset(uint32_t ArrayIndex, GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                GMM_GFX_SIZE_T Offset = 0;

                __GMM_ASSERT(ArrayIndex < Surf.ArraySize);
                __GMM_ASSERT(GMM_IS_PLANAR(Surf.Format));

                if (Surf.Flags.Gpu.UnifiedAuxSurface  &&
                    !(GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS))
                {
                    if (GmmAuxType == GMM_AUX_Y_CCS)
                    {
                        Offset = Surf.Size;
                    }
                    else if (GmmAuxType == GMM_AUX_UV_CCS)
                    {
                        Offset = Surf.Size + (AuxSurf.Pitch * AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U]); //Aux Offset in HwLayout

                        if (Surf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS)
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                        }
                        else if (Surf.Flags.Gpu.MMC && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS )
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y];
                        }
                    }
                    else if (GmmAuxType == GMM_AUX_COMP_STATE)
                    {
                        Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                    }

                    Offset += AuxSurf.OffsetInfo.Plane.ArrayQPitch * ArrayIndex;
                }
                else
                {
                    Offset = 0;
                }

                return Offset;
            }